

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O0

bool __thiscall
cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::matches(cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,string *input)

{
  string_view sVar1;
  string_view sVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  __type local_71;
  __type local_19;
  bool matched;
  string *input_local;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  local_19 = false;
  if (this->Type == Zero) {
    local_19 = std::operator==(input,&this->Name);
  }
  else if (this->SeparatorNeeded == No) {
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
    local_19 = cmHasPrefix(sVar2,sVar1);
  }
  else {
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
    bVar3 = cmHasPrefix(sVar2,sVar1);
    if (bVar3) {
      lVar4 = std::__cxx11::string::size();
      lVar5 = std::__cxx11::string::size();
      if (lVar4 == lVar5) {
        local_19 = true;
      }
      else {
        std::__cxx11::string::size();
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)input);
        local_71 = true;
        if (*pcVar6 != '=') {
          std::__cxx11::string::size();
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)input);
          local_71 = *pcVar6 == ' ';
        }
        local_19 = local_71;
      }
    }
  }
  return local_19;
}

Assistant:

bool matches(std::string const& input) const
  {
    bool matched = false;
    if (this->Type == Values::Zero) {
      matched = (input == this->Name);
    } else if (this->SeparatorNeeded == RequiresSeparator::No) {
      matched = cmHasPrefix(input, this->Name);
    } else if (cmHasPrefix(input, this->Name)) {
      if (input.size() == this->Name.size()) {
        matched = true;
      } else {
        matched =
          (input[this->Name.size()] == '=' || input[this->Name.size()] == ' ');
      }
    }
    return matched;
  }